

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_hitbox(_glist *x,t_gobj *y,int xpos,int ypos,int *x1p,int *y1p,int *x2p,int *y2p)

{
  int iVar1;
  int local_48;
  int local_44;
  int y2;
  int x2;
  int y1;
  int x1;
  int *y1p_local;
  int *x1p_local;
  int ypos_local;
  int xpos_local;
  t_gobj *y_local;
  _glist *x_local;
  
  _y1 = y1p;
  y1p_local = x1p;
  x1p_local._0_4_ = ypos;
  x1p_local._4_4_ = xpos;
  _ypos_local = y;
  y_local = (t_gobj *)x;
  iVar1 = gobj_shouldvis(y,x);
  if (iVar1 == 0) {
    x_local._4_4_ = 0;
  }
  else {
    gobj_getrect(_ypos_local,(_glist *)y_local,&x2,&y2,&local_44,&local_48);
    if ((((x1p_local._4_4_ < x2) || (local_44 < x1p_local._4_4_)) || ((int)x1p_local < y2)) ||
       (local_48 < (int)x1p_local)) {
      x_local._4_4_ = 0;
    }
    else {
      *y1p_local = x2;
      *_y1 = y2;
      *x2p = local_44;
      *y2p = local_48;
      x_local._4_4_ = 1;
    }
  }
  return x_local._4_4_;
}

Assistant:

int canvas_hitbox(t_canvas *x, t_gobj *y, int xpos, int ypos,
    int *x1p, int *y1p, int *x2p, int *y2p)
{
    int x1, y1, x2, y2;
    if (!gobj_shouldvis(y, x))
        return (0);
    gobj_getrect(y, x, &x1, &y1, &x2, &y2);
    if (xpos >= x1 && xpos <= x2 && ypos >= y1 && ypos <= y2)
    {
        *x1p = x1;
        *y1p = y1;
        *x2p = x2;
        *y2p = y2;
        return (1);
    }
    else return (0);
}